

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxWhileLoop::Emit(FxWhileLoop *this,VMFunctionBuilder *build)

{
  BYTE BVar1;
  int iVar2;
  size_t target;
  size_t sVar3;
  ExpEmit EVar4;
  FScriptPosition *other;
  TArray<unsigned_long,_unsigned_long> no;
  TArray<unsigned_long,_unsigned_long> yes;
  TArray<unsigned_long,_unsigned_long> local_58;
  TArray<unsigned_long,_unsigned_long> local_48;
  PString *local_38;
  FString local_30;
  
  if (this->Condition->ValueType != (PType *)TypeBool) {
    __assert_fail("Condition->ValueType == TypeBool",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x237c,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
  }
  local_48.Array = (unsigned_long *)0x0;
  local_48.Most = 0;
  local_48.Count = 0;
  local_58.Array = (unsigned_long *)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  target = VMFunctionBuilder::GetAddress(build);
  iVar2 = (*this->Condition->_vptr_FxExpression[3])();
  if ((char)iVar2 == '\0') {
    (*this->Condition->_vptr_FxExpression[10])(this->Condition,build,0,&local_48,&local_58);
  }
  else {
    local_38 = (PString *)this->Condition[1]._vptr_FxExpression;
    other = &this->Condition[1].ScriptPosition;
    if (local_38 == TypeString) {
      FString::AttachToOther(&local_30,&other->FileName);
    }
    else {
      local_30.Chars = (other->FileName).Chars;
    }
    BVar1 = (local_38->super_PBasicType).super_PType.RegType;
    if (BVar1 == '\x01') {
      if (((double)local_30.Chars == 0.0) && (!NAN((double)local_30.Chars))) goto LAB_00537a66;
    }
    else if ((BVar1 != '\0') || ((int)local_30.Chars == 0)) {
LAB_00537a66:
      __assert_fail("static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0x2387,"virtual ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *)");
    }
    if (local_38 == TypeString) {
      FString::~FString(&local_30);
    }
  }
  VMFunctionBuilder::BackpatchListToHere(build,&local_48);
  if (this->Code != (FxExpression *)0x0) {
    FxExpression::EmitStatement(this->Code,build);
  }
  sVar3 = VMFunctionBuilder::Emit(build,0x44,0);
  VMFunctionBuilder::Backpatch(build,sVar3,target);
  VMFunctionBuilder::BackpatchListToHere(build,&local_58);
  sVar3 = VMFunctionBuilder::GetAddress(build);
  FxLoopStatement::Backpatch(&this->super_FxLoopStatement,build,target,sVar3);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_58);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_48);
  EVar4.RegNum = 0;
  EVar4.RegType = 0x80;
  EVar4.RegCount = '\x01';
  EVar4.Konst = false;
  EVar4.Fixed = false;
  EVar4.Final = false;
  EVar4.Target = false;
  return EVar4;
}

Assistant:

ExpEmit FxWhileLoop::Emit(VMFunctionBuilder *build)
{
	assert(Condition->ValueType == TypeBool);

	size_t loopstart, loopend;
	TArray<size_t> yes, no;

	// Evaluate the condition and execute/break out of the loop.
	loopstart = build->GetAddress();
	if (!Condition->isConstant())
	{
		Condition->EmitCompare(build, false, yes, no);
	}
	else assert(static_cast<FxConstant *>(Condition)->GetValue().GetBool() == true);

	build->BackpatchListToHere(yes);
	// Execute the loop's content.
	if (Code != nullptr)
	{
		Code->EmitStatement(build);
	}

	// Loop back.
	build->Backpatch(build->Emit(OP_JMP, 0), loopstart);
	build->BackpatchListToHere(no);
	loopend = build->GetAddress();
	Backpatch(build, loopstart, loopend);
	return ExpEmit();
}